

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

void __thiscall
libcellml::XmlNode::setAttribute(XmlNode *this,char *attributeName,char *attributeValue)

{
  long lVar1;
  
  lVar1 = xmlHasProp(this->mPimpl->mXmlNodePtr);
  if (lVar1 != 0) {
    lVar1 = xmlHasProp(this->mPimpl->mXmlNodePtr,attributeName);
    xmlSetNsProp(this->mPimpl->mXmlNodePtr,*(undefined8 *)(lVar1 + 0x48),attributeName,
                 attributeValue);
    return;
  }
  return;
}

Assistant:

void XmlNode::setAttribute(const char *attributeName, const char *attributeValue)
{
    if (hasAttribute(attributeName)) {
        auto ns = getAttributeNamespace(mPimpl->mXmlNodePtr, attributeName);
        xmlSetNsProp(mPimpl->mXmlNodePtr, ns, reinterpret_cast<const xmlChar *>(attributeName), reinterpret_cast<const xmlChar *>(attributeValue));
    }
}